

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O2

void deqp::gles3::Functional::DepthStencilCaseUtil::render
               (QuadRenderer *renderer,RenderCommand *command,int viewportX,int viewportY)

{
  float fVar1;
  undefined8 uVar2;
  GLenum err;
  uint face;
  long lVar3;
  bool bVar4;
  Quad quad;
  
  if ((command->params).stencilTestEnabled == true) {
    glwEnable(0xb90);
    for (lVar3 = 0; lVar3 != 0x38; lVar3 = lVar3 + 0x1c) {
      face = lVar3 == 0x1c | 0x404;
      glwStencilFuncSeparate
                (face,*(GLenum *)((long)&(command->params).stencil[0].function + lVar3),
                 *(GLint *)((long)&(command->params).stencil[0].reference + lVar3),
                 *(GLuint *)((long)&(command->params).stencil[0].compareMask + lVar3));
      glwStencilOpSeparate
                (face,*(GLenum *)((long)&(command->params).stencil[0].stencilFailOp + lVar3),
                 *(GLenum *)((long)&(command->params).stencil[0].depthFailOp + lVar3),
                 *(GLenum *)((long)&(command->params).stencil[0].depthPassOp + lVar3));
      glwStencilMaskSeparate
                (face,*(GLuint *)((long)&(command->params).stencil[0].writeMask + lVar3));
    }
  }
  else {
    glwDisable(0xb90);
  }
  if ((command->params).depthTestEnabled == true) {
    glwEnable(0xb71);
    glwDepthFunc((command->params).depthFunc);
    glwDepthMask((command->params).depthWriteMask);
  }
  else {
    glwDisable(0xb71);
  }
  glwColorMask((command->colorMask).m_data[0],(command->colorMask).m_data[1],
               (command->colorMask).m_data[2],(command->colorMask).m_data[3]);
  glwViewport(viewportX + (command->rect).left,viewportY + (command->rect).bottom,
              (command->rect).width,(command->rect).height);
  deqp::gls::FragmentOpUtil::Quad::Quad(&quad);
  bVar4 = (command->params).visibleFace != FACETYPE_FRONT;
  quad.posB.m_data[0] = -1.0;
  if (!bVar4) {
    quad.posB.m_data[0] = 1.0;
  }
  quad.posA.m_data[0] = (float)((uint)bVar4 * -0x80000000 + -0x40800000);
  quad.posA.m_data[1] = -1.0;
  quad.posB.m_data[1] = 1.0;
  for (lVar3 = 0x10; lVar3 != 0x50; lVar3 = lVar3 + 0x10) {
    uVar2 = *(undefined8 *)((command->color).m_data + 2);
    *(undefined8 *)((long)quad.posA.m_data + lVar3) = *(undefined8 *)(command->color).m_data;
    *(undefined8 *)((long)quad.posB.m_data + lVar3) = uVar2;
  }
  fVar1 = (command->params).depth;
  for (lVar3 = 0x90; lVar3 != 0xa0; lVar3 = lVar3 + 4) {
    *(float *)((long)quad.posA.m_data + lVar3) = fVar1;
  }
  deqp::gls::FragmentOpUtil::QuadRenderer::render(renderer,&quad);
  err = glwGetError();
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDepthStencilTests.cpp"
                  ,0x1de);
  return;
}

Assistant:

void render (gls::FragmentOpUtil::QuadRenderer& renderer, const RenderCommand& command, int viewportX, int viewportY)
{
	if (command.params.stencilTestEnabled)
	{
		glEnable(GL_STENCIL_TEST);

		for (int face = 0; face < rr::FACETYPE_LAST; face++)
		{
			deUint32				glFace	= face == rr::FACETYPE_BACK ? GL_BACK : GL_FRONT;
			const StencilParams&	sParams	= command.params.stencil[face];

			glStencilFuncSeparate(glFace, sParams.function, sParams.reference, sParams.compareMask);
			glStencilOpSeparate(glFace, sParams.stencilFailOp, sParams.depthFailOp, sParams.depthPassOp);
			glStencilMaskSeparate(glFace, sParams.writeMask);
		}
	}
	else
		glDisable(GL_STENCIL_TEST);

	if (command.params.depthTestEnabled)
	{
		glEnable(GL_DEPTH_TEST);
		glDepthFunc(command.params.depthFunc);
		glDepthMask(command.params.depthWriteMask ? GL_TRUE : GL_FALSE);
	}
	else
		glDisable(GL_DEPTH_TEST);

	glColorMask(command.colorMask[0] ? GL_TRUE : GL_FALSE,
				command.colorMask[1] ? GL_TRUE : GL_FALSE,
				command.colorMask[2] ? GL_TRUE : GL_FALSE,
				command.colorMask[3] ? GL_TRUE : GL_FALSE);
	glViewport(command.rect.left+viewportX, command.rect.bottom+viewportY, command.rect.width, command.rect.height);

	gls::FragmentOpUtil::Quad quad;

	bool isFrontFacing = command.params.visibleFace == rr::FACETYPE_FRONT;
	quad.posA = Vec2(isFrontFacing ? -1.0f :  1.0f, -1.0f);
	quad.posB = Vec2(isFrontFacing ?  1.0f : -1.0f,  1.0f);

	std::fill(DE_ARRAY_BEGIN(quad.color), DE_ARRAY_END(quad.color), command.color);
	std::fill(DE_ARRAY_BEGIN(quad.depth), DE_ARRAY_END(quad.depth), command.params.depth);

	renderer.render(quad);
	GLU_CHECK();
}